

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaTypeDump(xmlSchemaTypePtr type,FILE *output)

{
  long *plVar1;
  int *piVar2;
  xmlChar *pxVar3;
  char *pcVar4;
  int *piVar5;
  long lVar6;
  size_t sStack_50;
  xmlChar *local_40;
  xmlSchemaTypePtr local_38;
  
  if (type == (xmlSchemaTypePtr)0x0) {
    fwrite("Type: NULL\n",0xb,1,(FILE *)output);
    return;
  }
  fwrite("Type: ",6,1,(FILE *)output);
  if (type->name == (xmlChar *)0x0) {
    fwrite("(no name) ",10,1,(FILE *)output);
  }
  else {
    fprintf((FILE *)output,"\'%s\' ");
  }
  if (type->targetNamespace != (xmlChar *)0x0) {
    fprintf((FILE *)output,"ns \'%s\' ");
  }
  switch(type->type) {
  case XML_SCHEMA_TYPE_BASIC:
    pcVar4 = "[basic] ";
    sStack_50 = 8;
    break;
  default:
    fprintf((FILE *)output,"[unknown type %d] ");
    goto LAB_001aa477;
  case XML_SCHEMA_TYPE_SIMPLE:
    pcVar4 = "[simple] ";
    goto LAB_001aa45e;
  case XML_SCHEMA_TYPE_COMPLEX:
    pcVar4 = "[complex] ";
    sStack_50 = 10;
    break;
  case XML_SCHEMA_TYPE_SEQUENCE:
    pcVar4 = "[sequence] ";
    sStack_50 = 0xb;
    break;
  case XML_SCHEMA_TYPE_CHOICE:
    pcVar4 = "[choice] ";
LAB_001aa45e:
    sStack_50 = 9;
    break;
  case XML_SCHEMA_TYPE_ALL:
    pcVar4 = "[all] ";
    sStack_50 = 6;
    break;
  case XML_SCHEMA_TYPE_UR:
    pcVar4 = "[ur] ";
    sStack_50 = 5;
    break;
  case XML_SCHEMA_TYPE_RESTRICTION:
    pcVar4 = "[restriction] ";
    sStack_50 = 0xe;
    break;
  case XML_SCHEMA_TYPE_EXTENSION:
    pcVar4 = "[extension] ";
    sStack_50 = 0xc;
  }
  fwrite(pcVar4,sStack_50,1,(FILE *)output);
LAB_001aa477:
  fwrite("content: ",9,1,(FILE *)output);
  switch(type->contentType) {
  case XML_SCHEMA_CONTENT_UNKNOWN:
    pcVar4 = "[unknown] ";
    goto LAB_001aa4d3;
  case XML_SCHEMA_CONTENT_EMPTY:
    pcVar4 = "[empty] ";
    goto LAB_001aa4de;
  case XML_SCHEMA_CONTENT_ELEMENTS:
    pcVar4 = "[element] ";
LAB_001aa4d3:
    sStack_50 = 10;
    break;
  case XML_SCHEMA_CONTENT_MIXED:
    pcVar4 = "[mixed] ";
    goto LAB_001aa4de;
  case XML_SCHEMA_CONTENT_SIMPLE:
    pcVar4 = "[simple] ";
    sStack_50 = 9;
    break;
  default:
    goto switchD_001aa4a4_caseD_5;
  case XML_SCHEMA_CONTENT_BASIC:
    pcVar4 = "[basic] ";
LAB_001aa4de:
    sStack_50 = 8;
    break;
  case XML_SCHEMA_CONTENT_ANY:
    pcVar4 = "[any] ";
    sStack_50 = 6;
  }
  fwrite(pcVar4,sStack_50,1,(FILE *)output);
switchD_001aa4a4_caseD_5:
  fputc(10,(FILE *)output);
  if (type->base != (xmlChar *)0x0) {
    fprintf((FILE *)output,"  base type: \'%s\'");
    if (type->baseNs == (xmlChar *)0x0) {
      fputc(10,(FILE *)output);
    }
    else {
      fprintf((FILE *)output," ns \'%s\'\n");
    }
  }
  plVar1 = (long *)type->attrUses;
  if ((plVar1 != (long *)0x0) && (local_40 = (xmlChar *)0x0, local_38 = type, (int)plVar1[1] != 0))
  {
    fwrite("  attributes:\n",0xe,1,(FILE *)output);
    for (lVar6 = 0; type = local_38, lVar6 < (int)plVar1[1]; lVar6 = lVar6 + 1) {
      piVar5 = *(int **)(*plVar1 + lVar6 * 8);
      if (*piVar5 == 2000) {
        fwrite("  [reference] ",0xe,1,(FILE *)output);
        piVar2 = piVar5 + 6;
        piVar5 = piVar5 + 8;
      }
      else if (*piVar5 == 0x7d1) {
        fwrite("  [prohibition] ",0x10,1,(FILE *)output);
        piVar2 = piVar5 + 4;
        piVar5 = piVar5 + 6;
      }
      else {
        fwrite("  [use] ",8,1,(FILE *)output);
        piVar2 = (int *)(*(long *)(piVar5 + 6) + 0x10);
        piVar5 = (int *)(*(long *)(piVar5 + 6) + 0x70);
      }
      pxVar3 = xmlSchemaFormatQName(&local_40,*(xmlChar **)piVar5,*(xmlChar **)piVar2);
      fprintf((FILE *)output,"\'%s\'\n",pxVar3);
      if (local_40 != (xmlChar *)0x0) {
        (*xmlFree)(local_40);
        local_40 = (xmlChar *)0x0;
      }
    }
  }
  if (type->annot != (xmlSchemaAnnotPtr)0x0) {
    xmlSchemaAnnotDump(output,type->annot);
  }
  if ((type->type == XML_SCHEMA_TYPE_COMPLEX) && (type->subtypes != (xmlSchemaTypePtr)0x0)) {
    xmlSchemaContentModelDump((xmlSchemaParticlePtr)type->subtypes,output,1);
    return;
  }
  return;
}

Assistant:

static void
xmlSchemaTypeDump(xmlSchemaTypePtr type, FILE * output)
{
    if (type == NULL) {
        fprintf(output, "Type: NULL\n");
        return;
    }
    fprintf(output, "Type: ");
    if (type->name != NULL)
        fprintf(output, "'%s' ", type->name);
    else
        fprintf(output, "(no name) ");
    if (type->targetNamespace != NULL)
	fprintf(output, "ns '%s' ", type->targetNamespace);
    switch (type->type) {
        case XML_SCHEMA_TYPE_BASIC:
            fprintf(output, "[basic] ");
            break;
        case XML_SCHEMA_TYPE_SIMPLE:
            fprintf(output, "[simple] ");
            break;
        case XML_SCHEMA_TYPE_COMPLEX:
            fprintf(output, "[complex] ");
            break;
        case XML_SCHEMA_TYPE_SEQUENCE:
            fprintf(output, "[sequence] ");
            break;
        case XML_SCHEMA_TYPE_CHOICE:
            fprintf(output, "[choice] ");
            break;
        case XML_SCHEMA_TYPE_ALL:
            fprintf(output, "[all] ");
            break;
        case XML_SCHEMA_TYPE_UR:
            fprintf(output, "[ur] ");
            break;
        case XML_SCHEMA_TYPE_RESTRICTION:
            fprintf(output, "[restriction] ");
            break;
        case XML_SCHEMA_TYPE_EXTENSION:
            fprintf(output, "[extension] ");
            break;
        default:
            fprintf(output, "[unknown type %d] ", type->type);
            break;
    }
    fprintf(output, "content: ");
    switch (type->contentType) {
        case XML_SCHEMA_CONTENT_UNKNOWN:
            fprintf(output, "[unknown] ");
            break;
        case XML_SCHEMA_CONTENT_EMPTY:
            fprintf(output, "[empty] ");
            break;
        case XML_SCHEMA_CONTENT_ELEMENTS:
            fprintf(output, "[element] ");
            break;
        case XML_SCHEMA_CONTENT_MIXED:
            fprintf(output, "[mixed] ");
            break;
        case XML_SCHEMA_CONTENT_MIXED_OR_ELEMENTS:
	/* not used. */
            break;
        case XML_SCHEMA_CONTENT_BASIC:
            fprintf(output, "[basic] ");
            break;
        case XML_SCHEMA_CONTENT_SIMPLE:
            fprintf(output, "[simple] ");
            break;
        case XML_SCHEMA_CONTENT_ANY:
            fprintf(output, "[any] ");
            break;
    }
    fprintf(output, "\n");
    if (type->base != NULL) {
        fprintf(output, "  base type: '%s'", type->base);
	if (type->baseNs != NULL)
	    fprintf(output, " ns '%s'\n", type->baseNs);
	else
	    fprintf(output, "\n");
    }
    if (type->attrUses != NULL)
	xmlSchemaAttrUsesDump(type->attrUses, output);
    if (type->annot != NULL)
        xmlSchemaAnnotDump(output, type->annot);
#ifdef DUMP_CONTENT_MODEL
    if ((type->type == XML_SCHEMA_TYPE_COMPLEX) &&
	(type->subtypes != NULL)) {
	xmlSchemaContentModelDump((xmlSchemaParticlePtr) type->subtypes,
	    output, 1);
    }
#endif
}